

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t
ctrl_get_num_operating_points(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  long *local_38;
  int *arg;
  __va_list_tag *args_local;
  aom_codec_alg_priv_t_conflict *ctx_local;
  aom_codec_err_t local_4;
  
  uVar1 = args->gp_offset;
  if (uVar1 < 0x29) {
    local_38 = (long *)((long)(int)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    local_38 = (long *)args->overflow_arg_area;
    args->overflow_arg_area = local_38 + 1;
  }
  if ((int *)*local_38 == (int *)0x0) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    *(int *)*local_38 = (ctx->ppi->seq_params).operating_points_cnt_minus_1 + 1;
    local_4 = AOM_CODEC_OK;
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_get_num_operating_points(aom_codec_alg_priv_t *ctx,
                                                     va_list args) {
  int *const arg = va_arg(args, int *);
  if (arg == NULL) return AOM_CODEC_INVALID_PARAM;
  *arg = ctx->ppi->seq_params.operating_points_cnt_minus_1 + 1;
  return AOM_CODEC_OK;
}